

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

char * luaT_objtypename(lua_State *L,TValue *o)

{
  code cVar1;
  byte bVar2;
  ushort uVar3;
  TString *pTVar4;
  GCObject *pGVar5;
  uint uVar6;
  TString *key;
  TValue *n;
  char *__function;
  char *__file;
  char *__assertion;
  long lVar7;
  
  uVar3 = o->tt_;
  uVar6 = (uint)uVar3;
  if (uVar3 == 0x8025) {
LAB_001210c6:
    cVar1 = (o->value_).f[8];
    if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
      __assertion = 
      "((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      __file = "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
      ;
      __function = "const char *luaT_objtypename(lua_State *, const TValue *)";
      uVar6 = 0x62;
      goto LAB_00121252;
    }
    lVar7 = *(long *)((o->value_).f + 0x38);
    if (lVar7 == 0) goto LAB_0012119a;
  }
  else if (uVar3 == 0x8007) {
    if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
      __assertion = "(((o)->value_).gc)->tt == 7";
      __file = "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
      ;
      __function = "const char *luaT_objtypename(lua_State *, const TValue *)";
      uVar6 = 0x61;
      goto LAB_00121252;
    }
    lVar7 = *(long *)((o->value_).f + 0x10);
    if (lVar7 == 0) {
      uVar6 = 0x8007;
      goto LAB_0012119a;
    }
  }
  else {
    if (uVar3 == 0x8015) goto LAB_001210c6;
    if (uVar3 != 0x8005) goto LAB_0012119a;
    if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
      __assertion = "(((o)->value_).gc)->tt == 5";
      __file = "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
      ;
      __function = "const char *luaT_objtypename(lua_State *, const TValue *)";
      uVar6 = 0x60;
      goto LAB_00121252;
    }
    lVar7 = *(long *)((o->value_).f + 0x28);
    if (lVar7 == 0) {
      uVar6 = 0x8005;
      goto LAB_0012119a;
    }
  }
  key = luaS_new(L,"__name");
  if (key->tt != '\x04') {
    __assertion = "key->tt == ((4) | ((0) << 4))";
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h";
    __function = "const TValue *luaH_getshortstr(Table *, TString *)";
    uVar6 = 0x5a;
    goto LAB_00121252;
  }
  n = (TValue *)((ulong)(*(uint *)(lVar7 + 0x38) & key->hash) * 0x20 + *(long *)(lVar7 + 0x18));
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar4 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    bVar2 = pTVar4->tt;
    if ((bVar2 & 0xf) == 4) {
      if (bVar2 == 4) {
        if (pTVar4 != key) goto LAB_00121158;
        goto LAB_0012116f;
      }
      __assertion = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
    }
    else {
      __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
    }
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h";
    __function = "const TValue *luaH_getshortstr(Table *, TString *)";
    uVar6 = 0x5c;
  }
  else {
LAB_00121158:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(key,(Node *)n);
    }
LAB_0012116f:
    if (((((Node *)n)->i_val).tt_ & 0xf) != 4) {
      uVar6 = (uint)o->tt_;
LAB_0012119a:
      return luaT_typenames_[(uVar6 & 0xf) + 1];
    }
    pGVar5 = (((Node *)n)->i_val).value_.gc;
    if ((pGVar5->tt & 0xf) == 4) {
      return (char *)&pGVar5[1].tt;
    }
    __assertion = "(((((name)->value_).gc)->tt) & 0x0F) == 4";
    __file = "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c";
    __function = "const char *luaT_objtypename(lua_State *, const TValue *)";
    uVar6 = 0x65;
  }
LAB_00121252:
  __assert_fail(__assertion,__file,uVar6,__function);
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttisLtable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL) ||
      (ttisarray(o) && (mt = arrvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttnov(o));  /* else use standard type name */
}